

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteDot.c
# Opt level: O0

void Io_WriteDotNtk(Abc_Ntk_t *pNtk,Vec_Ptr_t *vNodes,Vec_Ptr_t *vNodesShow,char *pFileName,
                   int fGateNames,int fUseReverse)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  FILE *__stream;
  void *pvVar6;
  Abc_Obj_t *pAVar7;
  char *pcVar8;
  Abc_Obj_t *pAVar9;
  char *local_130;
  bool local_109;
  char *local_e8;
  uint local_74;
  int Limit;
  int Prev;
  int fCompl;
  int fHasBdds;
  int k;
  int i;
  int Level;
  int fHasCos;
  int LevelMax;
  int LevelMin;
  char *pSopString;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode;
  FILE *pFile;
  int fUseReverse_local;
  int fGateNames_local;
  char *pFileName_local;
  Vec_Ptr_t *vNodesShow_local;
  Vec_Ptr_t *vNodes_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if ((iVar1 == 0) && (iVar1 = Abc_NtkIsLogic(pNtk), iVar1 == 0)) {
    __assert_fail("Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteDot.c"
                  ,0x4f,
                  "void Io_WriteDotNtk(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, char *, int, int)");
  }
  if (vNodes->nSize < 1) {
    printf("The set has no nodes. DOT file is not written.\n");
  }
  else if (vNodes->nSize < 0x1f5) {
    __stream = fopen(pFileName,"w");
    if (__stream == (FILE *)0x0) {
      fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",pFileName);
    }
    else {
      iVar1 = Abc_NtkIsBddLogic(pNtk);
      if ((iVar1 == 0) || (iVar2 = Abc_NtkBddToSop(pNtk,-1,1000000000), iVar2 != 0)) {
        for (fHasBdds = 0; iVar2 = Vec_PtrSize(vNodes), fHasBdds < iVar2; fHasBdds = fHasBdds + 1) {
          pvVar6 = Vec_PtrEntry(vNodes,fHasBdds);
          *(uint *)((long)pvVar6 + 0x14) = *(uint *)((long)pvVar6 + 0x14) & 0xffffffbf | 0x40;
        }
        if (vNodesShow != (Vec_Ptr_t *)0x0) {
          for (fHasBdds = 0; iVar2 = Vec_PtrSize(vNodesShow), fHasBdds < iVar2;
              fHasBdds = fHasBdds + 1) {
            pvVar6 = Vec_PtrEntry(vNodesShow,fHasBdds);
            *(uint *)((long)pvVar6 + 0x14) = *(uint *)((long)pvVar6 + 0x14) & 0xffffffdf | 0x20;
          }
        }
        iVar2 = Abc_NtkLevel(pNtk);
        if (fUseReverse != 0) {
          iVar3 = Abc_NtkLevelReverse(pNtk);
          if (iVar2 != iVar3) {
            __assert_fail("LevelMax == LevelMin",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteDot.c"
                          ,0x7a,
                          "void Io_WriteDotNtk(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, char *, int, int)"
                         );
          }
          for (fHasBdds = 0; iVar3 = Vec_PtrSize(vNodes), fHasBdds < iVar3; fHasBdds = fHasBdds + 1)
          {
            pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,fHasBdds);
            iVar3 = Abc_ObjIsNode(pAVar7);
            if (iVar3 != 0) {
              *(uint *)&pAVar7->field_0x14 =
                   *(uint *)&pAVar7->field_0x14 & 0xfff |
                   ((iVar2 - (*(uint *)&pAVar7->field_0x14 >> 0xc)) + 1) * 0x1000;
            }
          }
        }
        fHasCos = 10000;
        Level = -1;
        i = 0;
        for (fHasBdds = 0; iVar2 = Vec_PtrSize(vNodes), fHasBdds < iVar2; fHasBdds = fHasBdds + 1) {
          pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,fHasBdds);
          iVar2 = Abc_ObjIsCo(pAVar7);
          if (iVar2 == 0) {
            if (*(uint *)&pAVar7->field_0x14 >> 0xc < (uint)fHasCos) {
              fHasCos = *(uint *)&pAVar7->field_0x14 >> 0xc;
            }
            if (Level < (int)(*(uint *)&pAVar7->field_0x14 >> 0xc)) {
              Level = *(uint *)&pAVar7->field_0x14 >> 0xc;
            }
          }
          else {
            i = 1;
          }
        }
        if (i != 0) {
          Level = Level + 1;
          for (fHasBdds = 0; iVar2 = Vec_PtrSize(vNodes), fHasBdds < iVar2; fHasBdds = fHasBdds + 1)
          {
            pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,fHasBdds);
            iVar2 = Abc_ObjIsCo(pAVar7);
            if (iVar2 != 0) {
              *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 & 0xfff | Level * 0x1000;
            }
          }
        }
        fprintf(__stream,"# %s\n","Network structure generated by ABC");
        fprintf(__stream,"\n");
        fprintf(__stream,"digraph network {\n");
        fprintf(__stream,"size = \"7.5,10\";\n");
        fprintf(__stream,"center = true;\n");
        fprintf(__stream,"edge [dir = back];\n");
        fprintf(__stream,"\n");
        fprintf(__stream,"{\n");
        fprintf(__stream,"  node [shape = plaintext];\n");
        fprintf(__stream,"  edge [style = invis];\n");
        fprintf(__stream,"  LevelTitle1 [label=\"\"];\n");
        fprintf(__stream,"  LevelTitle2 [label=\"\"];\n");
        for (k = Level; fHasCos <= k; k = k + -1) {
          fprintf(__stream,"  Level%d",(ulong)(uint)k);
          fprintf(__stream," [label = ");
          fprintf(__stream,"\"");
          fprintf(__stream,"\"");
          fprintf(__stream,"];\n");
        }
        fprintf(__stream,"  LevelTitle1 ->  LevelTitle2 ->");
        for (k = Level; fHasCos <= k; k = k + -1) {
          fprintf(__stream,"  Level%d",(ulong)(uint)k);
          if (k == fHasCos) {
            fprintf(__stream,";");
          }
          else {
            fprintf(__stream," ->");
          }
        }
        fprintf(__stream,"\n");
        fprintf(__stream,"}");
        fprintf(__stream,"\n");
        fprintf(__stream,"\n");
        fprintf(__stream,"{\n");
        fprintf(__stream,"  rank = same;\n");
        fprintf(__stream,"  LevelTitle1;\n");
        fprintf(__stream,"  title1 [shape=plaintext,\n");
        fprintf(__stream,"          fontsize=20,\n");
        fprintf(__stream,"          fontname = \"Times-Roman\",\n");
        fprintf(__stream,"          label=\"");
        fprintf(__stream,"%s","Network structure visualized by ABC");
        fprintf(__stream,"\\n");
        fprintf(__stream,"Benchmark \\\"%s\\\". ",pNtk->pName);
        pcVar8 = Extra_TimeStamp();
        fprintf(__stream,"Time was %s. ",pcVar8);
        fprintf(__stream,"\"\n");
        fprintf(__stream,"         ];\n");
        fprintf(__stream,"}");
        fprintf(__stream,"\n");
        fprintf(__stream,"\n");
        fprintf(__stream,"{\n");
        fprintf(__stream,"  rank = same;\n");
        fprintf(__stream,"  LevelTitle2;\n");
        fprintf(__stream,"  title2 [shape=plaintext,\n");
        fprintf(__stream,"          fontsize=18,\n");
        fprintf(__stream,"          fontname = \"Times-Roman\",\n");
        fprintf(__stream,"          label=\"");
        iVar2 = Abc_NtkObjNum(pNtk);
        iVar3 = Vec_PtrSize(vNodes);
        if (iVar2 == iVar3) {
          uVar4 = Abc_NtkNodeNum(pNtk);
          uVar5 = Abc_NtkLatchNum(pNtk);
          fprintf(__stream,"The network contains %d logic nodes and %d latches.",(ulong)uVar4,
                  (ulong)uVar5);
        }
        else {
          uVar4 = Abc_NtkCountLogicNodes(vNodes);
          fprintf(__stream,"The set contains %d logic nodes and spans %d levels.",(ulong)uVar4,
                  (ulong)((Level - fHasCos) + 1));
        }
        fprintf(__stream,"\\n");
        fprintf(__stream,"\"\n");
        fprintf(__stream,"         ];\n");
        fprintf(__stream,"}");
        fprintf(__stream,"\n");
        fprintf(__stream,"\n");
        if (i != 0) {
          fprintf(__stream,"{\n");
          fprintf(__stream,"  rank = same;\n");
          fprintf(__stream,"  Level%d;\n",(ulong)(uint)Level);
          for (fHasBdds = 0; iVar2 = Vec_PtrSize(vNodes), fHasBdds < iVar2; fHasBdds = fHasBdds + 1)
          {
            pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,fHasBdds);
            iVar2 = Abc_ObjIsCo(pAVar7);
            if (iVar2 != 0) {
              uVar4 = pAVar7->Id;
              iVar2 = Abc_ObjIsBi(pAVar7);
              if (iVar2 == 0) {
                local_e8 = Abc_ObjName(pAVar7);
              }
              else {
                pAVar9 = Abc_ObjFanout0(pAVar7);
                local_e8 = Abc_ObjName(pAVar9);
              }
              iVar2 = Abc_ObjIsBi(pAVar7);
              pcVar8 = "";
              if (iVar2 != 0) {
                pcVar8 = "_in";
              }
              fprintf(__stream,"  Node%d [label = \"%s%s\"",(ulong)uVar4,local_e8,pcVar8);
              iVar2 = Abc_ObjIsBi(pAVar7);
              pcVar8 = "invtriangle";
              if (iVar2 != 0) {
                pcVar8 = "box";
              }
              fprintf(__stream,", shape = %s",pcVar8);
              if ((*(uint *)&pAVar7->field_0x14 >> 5 & 1) != 0) {
                fprintf(__stream,", style = filled");
              }
              fprintf(__stream,", color = coral, fillcolor = coral");
              fprintf(__stream,"];\n");
            }
          }
          fprintf(__stream,"}");
          fprintf(__stream,"\n");
          fprintf(__stream,"\n");
        }
        for (k = Level - i; fHasCos <= k && 0 < k; k = k + -1) {
          fprintf(__stream,"{\n");
          fprintf(__stream,"  rank = same;\n");
          fprintf(__stream,"  Level%d;\n",(ulong)(uint)k);
          for (fHasBdds = 0; iVar2 = Vec_PtrSize(vNodes), fHasBdds < iVar2; fHasBdds = fHasBdds + 1)
          {
            pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,fHasBdds);
            if ((*(uint *)&pAVar7->field_0x14 >> 0xc == k) &&
               (iVar2 = Abc_ObjFaninNum(pAVar7), iVar2 != 0)) {
              iVar2 = Abc_NtkIsStrash(pNtk);
              if (iVar2 == 0) {
                iVar2 = Abc_NtkHasMapping(pNtk);
                if ((iVar2 == 0) || (fGateNames == 0)) {
                  iVar2 = Abc_NtkHasMapping(pNtk);
                  if (iVar2 == 0) {
                    _LevelMax = Abc_NtkPrintSop((char *)(pAVar7->field_5).pData);
                  }
                  else {
                    pcVar8 = Mio_GateReadSop((Mio_Gate_t *)(pAVar7->field_5).pData);
                    _LevelMax = Abc_NtkPrintSop(pcVar8);
                  }
                }
                else {
                  _LevelMax = Mio_GateReadName((Mio_Gate_t *)(pAVar7->field_5).pData);
                }
              }
              else {
                _LevelMax = "";
              }
              fprintf(__stream,"  Node%d [label = \"%d\\n%s\"",(ulong)(uint)pAVar7->Id,
                      (ulong)(uint)pAVar7->Id,_LevelMax);
              fprintf(__stream,", shape = ellipse");
              if ((*(uint *)&pAVar7->field_0x14 >> 5 & 1) != 0) {
                fprintf(__stream,", style = filled");
              }
              fprintf(__stream,"];\n");
            }
          }
          fprintf(__stream,"}");
          fprintf(__stream,"\n");
          fprintf(__stream,"\n");
        }
        if (fHasCos == 0) {
          fprintf(__stream,"{\n");
          fprintf(__stream,"  rank = same;\n");
          fprintf(__stream,"  Level%d;\n",0);
          for (fHasBdds = 0; iVar2 = Vec_PtrSize(vNodes), fHasBdds < iVar2; fHasBdds = fHasBdds + 1)
          {
            pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,fHasBdds);
            iVar2 = Abc_ObjIsCi(pAVar7);
            if (iVar2 == 0) {
              iVar2 = Abc_ObjFaninNum(pAVar7);
              if ((iVar2 == 0) && (iVar2 = Abc_ObjFanoutNum(pAVar7), 0 < iVar2)) {
                uVar4 = pAVar7->Id;
                iVar2 = Abc_NtkIsStrash(pAVar7->pNtk);
                local_109 = true;
                if (iVar2 == 0) {
                  iVar2 = Abc_NodeIsConst1(pAVar7);
                  local_109 = iVar2 != 0;
                }
                fprintf(__stream,"  Node%d [label = \"Const%d\"",(ulong)uVar4,(ulong)local_109);
                fprintf(__stream,", shape = ellipse");
                if ((*(uint *)&pAVar7->field_0x14 >> 5 & 1) != 0) {
                  fprintf(__stream,", style = filled");
                }
                fprintf(__stream,", color = coral, fillcolor = coral");
                fprintf(__stream,"];\n");
              }
            }
            else {
              uVar4 = pAVar7->Id;
              iVar2 = Abc_ObjIsBo(pAVar7);
              if (iVar2 == 0) {
                local_130 = Abc_ObjName(pAVar7);
              }
              else {
                pAVar9 = Abc_ObjFanin0(pAVar7);
                local_130 = Abc_ObjName(pAVar9);
              }
              fprintf(__stream,"  Node%d [label = \"%s\"",(ulong)uVar4,local_130);
              iVar2 = Abc_ObjIsBo(pAVar7);
              pcVar8 = ", shape = triangle";
              if (iVar2 != 0) {
                pcVar8 = ", shape = box";
              }
              fprintf(__stream,", shape = %s",pcVar8 + 10);
              if ((*(uint *)&pAVar7->field_0x14 >> 5 & 1) != 0) {
                fprintf(__stream,", style = filled");
              }
              fprintf(__stream,", color = coral, fillcolor = coral");
              fprintf(__stream,"];\n");
            }
          }
          fprintf(__stream,"}");
          fprintf(__stream,"\n");
          fprintf(__stream,"\n");
        }
        fprintf(__stream,"title1 -> title2 [style = invis];\n");
        for (fHasBdds = 0; iVar2 = Vec_PtrSize(vNodes), fHasBdds < iVar2; fHasBdds = fHasBdds + 1) {
          pvVar6 = Vec_PtrEntry(vNodes,fHasBdds);
          if (*(uint *)((long)pvVar6 + 0x14) >> 0xc == Level) {
            fprintf(__stream,"title2 -> Node%d [style = invis];\n",
                    (ulong)*(uint *)((long)pvVar6 + 0x10));
          }
        }
        local_74 = 0xffffffff;
        for (fHasBdds = 0; iVar2 = Vec_PtrSize(vNodes), fHasBdds < iVar2; fHasBdds = fHasBdds + 1) {
          pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,fHasBdds);
          if ((*(uint *)&pAVar7->field_0x14 >> 0xc == Level) &&
             (iVar2 = Abc_ObjIsPo(pAVar7), iVar2 != 0)) {
            if (-1 < (int)local_74) {
              fprintf(__stream,"Node%d -> Node%d [style = invis];\n",(ulong)local_74,
                      (ulong)(uint)pAVar7->Id);
            }
            local_74 = pAVar7->Id;
          }
        }
        for (fHasBdds = 0; iVar2 = Vec_PtrSize(vNodes), fHasBdds < iVar2; fHasBdds = fHasBdds + 1) {
          pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,fHasBdds);
          iVar2 = Abc_ObjIsLatch(pAVar7);
          if (iVar2 == 0) {
            for (fCompl = 0; iVar2 = Abc_ObjFaninNum(pAVar7), fCompl < iVar2; fCompl = fCompl + 1) {
              pAVar9 = Abc_ObjFanin(pAVar7,fCompl);
              iVar2 = Abc_ObjIsLatch(pAVar9);
              if (iVar2 == 0) {
                Limit = 0;
                iVar2 = Abc_NtkIsStrash(pNtk);
                if (iVar2 != 0) {
                  Limit = Abc_ObjFaninC(pAVar7,fCompl);
                }
                fprintf(__stream,"Node%d",(ulong)(uint)pAVar7->Id);
                fprintf(__stream," -> ");
                fprintf(__stream,"Node%d",(ulong)(uint)pAVar9->Id);
                pcVar8 = "solid";
                if (Limit != 0) {
                  pcVar8 = "dotted";
                }
                fprintf(__stream," [style = %s",pcVar8);
                fprintf(__stream,"]");
                fprintf(__stream,";\n");
              }
            }
          }
        }
        fprintf(__stream,"}");
        fprintf(__stream,"\n");
        fprintf(__stream,"\n");
        fclose(__stream);
        for (fHasBdds = 0; iVar2 = Vec_PtrSize(vNodes), fHasBdds < iVar2; fHasBdds = fHasBdds + 1) {
          pvVar6 = Vec_PtrEntry(vNodes,fHasBdds);
          *(uint *)((long)pvVar6 + 0x14) = *(uint *)((long)pvVar6 + 0x14) & 0xffffffbf;
        }
        if (vNodesShow != (Vec_Ptr_t *)0x0) {
          for (fHasBdds = 0; iVar2 = Vec_PtrSize(vNodesShow), fHasBdds < iVar2;
              fHasBdds = fHasBdds + 1) {
            pvVar6 = Vec_PtrEntry(vNodesShow,fHasBdds);
            *(uint *)((long)pvVar6 + 0x14) = *(uint *)((long)pvVar6 + 0x14) & 0xffffffdf;
          }
        }
        if (iVar1 != 0) {
          Abc_NtkSopToBdd(pNtk);
        }
      }
      else {
        printf("Io_WriteDotNtk(): Converting to SOPs has failed.\n");
      }
    }
  }
  else {
    printf("The set has more than %d nodes. DOT file is not written.\n",500);
  }
  return;
}

Assistant:

void Io_WriteDotNtk( Abc_Ntk_t * pNtk, Vec_Ptr_t * vNodes, Vec_Ptr_t * vNodesShow, char * pFileName, int fGateNames, int fUseReverse )
{
    FILE * pFile;
    Abc_Obj_t * pNode, * pFanin;
    char * pSopString;
    int LevelMin, LevelMax, fHasCos, Level, i, k, fHasBdds, fCompl, Prev;
    int Limit = 500;

    assert( Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk) );

    if ( vNodes->nSize < 1 )
    {
        printf( "The set has no nodes. DOT file is not written.\n" );
        return;
    }

    if ( vNodes->nSize > Limit )
    {
        printf( "The set has more than %d nodes. DOT file is not written.\n", Limit );
        return;
    }

    // start the stream
    if ( (pFile = fopen( pFileName, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", pFileName );
        return;
    }

    // transform logic functions from BDD to SOP
    if ( (fHasBdds = Abc_NtkIsBddLogic(pNtk)) )
    {
        if ( !Abc_NtkBddToSop(pNtk, -1, ABC_INFINITY) )
        {
            printf( "Io_WriteDotNtk(): Converting to SOPs has failed.\n" );
            return;
        }
    }

    // mark the nodes from the set
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        pNode->fMarkC = 1;
    if ( vNodesShow )
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodesShow, pNode, i )
            pNode->fMarkB = 1;

    // get the levels of nodes
    LevelMax = Abc_NtkLevel( pNtk );
    if ( fUseReverse )
    {
        LevelMin = Abc_NtkLevelReverse( pNtk );
        assert( LevelMax == LevelMin );
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
            if ( Abc_ObjIsNode(pNode) )
                pNode->Level = LevelMax - pNode->Level + 1;
    }

    // find the largest and the smallest levels
    LevelMin = 10000;
    LevelMax = -1;
    fHasCos  = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( Abc_ObjIsCo(pNode) )
        {
            fHasCos = 1;
            continue;
        }
        if ( LevelMin > (int)pNode->Level )
            LevelMin = pNode->Level;
        if ( LevelMax < (int)pNode->Level )
            LevelMax = pNode->Level;
    }

    // set the level of the CO nodes
    if ( fHasCos )
    {
        LevelMax++;
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        {
            if ( Abc_ObjIsCo(pNode) )
                pNode->Level = LevelMax;
        }
    }

    // write the DOT header
    fprintf( pFile, "# %s\n",  "Network structure generated by ABC" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "digraph network {\n" );
    fprintf( pFile, "size = \"7.5,10\";\n" );
//    fprintf( pFile, "size = \"10,8.5\";\n" );
//    fprintf( pFile, "size = \"14,11\";\n" );
//    fprintf( pFile, "page = \"8,11\";\n" );
//  fprintf( pFile, "ranksep = 0.5;\n" );
//  fprintf( pFile, "nodesep = 0.5;\n" );
    fprintf( pFile, "center = true;\n" );
//    fprintf( pFile, "orientation = landscape;\n" );
//  fprintf( pFile, "edge [fontsize = 10];\n" );
//  fprintf( pFile, "edge [dir = none];\n" );
    fprintf( pFile, "edge [dir = back];\n" );
    fprintf( pFile, "\n" );

    // labels on the left of the picture
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  node [shape = plaintext];\n" );
    fprintf( pFile, "  edge [style = invis];\n" );
    fprintf( pFile, "  LevelTitle1 [label=\"\"];\n" );
    fprintf( pFile, "  LevelTitle2 [label=\"\"];\n" );
    // generate node names with labels
    for ( Level = LevelMax; Level >= LevelMin; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d", Level );
        fprintf( pFile, " [label = " );
        // label name
        fprintf( pFile, "\"" );
        fprintf( pFile, "\"" );
        fprintf( pFile, "];\n" );
    }

    // genetate the sequence of visible/invisible nodes to mark levels
    fprintf( pFile, "  LevelTitle1 ->  LevelTitle2 ->" );
    for ( Level = LevelMax; Level >= LevelMin; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d",  Level );
        // the connector
        if ( Level != LevelMin )
            fprintf( pFile, " ->" );
        else
            fprintf( pFile, ";" );
    }
    fprintf( pFile, "\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate title box on top
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle1;\n" );
    fprintf( pFile, "  title1 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=20,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "%s", "Network structure visualized by ABC" );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "Benchmark \\\"%s\\\". ", pNtk->pName );
    fprintf( pFile, "Time was %s. ",  Extra_TimeStamp() );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate statistics box
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle2;\n" );
    fprintf( pFile, "  title2 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=18,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    if ( Abc_NtkObjNum(pNtk) == Vec_PtrSize(vNodes) )
        fprintf( pFile, "The network contains %d logic nodes and %d latches.", Abc_NtkNodeNum(pNtk), Abc_NtkLatchNum(pNtk) );
    else
        fprintf( pFile, "The set contains %d logic nodes and spans %d levels.", Abc_NtkCountLogicNodes(vNodes), LevelMax - LevelMin + 1 );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate the POs
    if ( fHasCos )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  LevelMax );
        // generate the PO nodes
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        {
            if ( !Abc_ObjIsCo(pNode) )
                continue;
            fprintf( pFile, "  Node%d [label = \"%s%s\"", 
                pNode->Id, 
                (Abc_ObjIsBi(pNode)? Abc_ObjName(Abc_ObjFanout0(pNode)):Abc_ObjName(pNode)), 
                (Abc_ObjIsBi(pNode)? "_in":"") );
            fprintf( pFile, ", shape = %s", (Abc_ObjIsBi(pNode)? "box":"invtriangle") );
            if ( pNode->fMarkB )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, ", color = coral, fillcolor = coral" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate nodes of each rank
    for ( Level = LevelMax - fHasCos; Level >= LevelMin && Level > 0; Level-- )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  Level );
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        {
            if ( (int)pNode->Level != Level )
                continue;
            if ( Abc_ObjFaninNum(pNode) == 0 )
                continue;

/*
            int SuppSize;
            Vec_Ptr_t * vSupp;
            if ( (int)pNode->Level != Level )
                continue;
            if ( Abc_ObjFaninNum(pNode) == 0 )
                continue;
            vSupp = Abc_NtkNodeSupport( pNtk, &pNode, 1 );
            SuppSize = Vec_PtrSize( vSupp );
            Vec_PtrFree( vSupp ); 
*/

//            fprintf( pFile, "  Node%d [label = \"%d\"", pNode->Id, pNode->Id );
            if ( Abc_NtkIsStrash(pNtk) )
                pSopString = "";
            else if ( Abc_NtkHasMapping(pNtk) && fGateNames )
                pSopString = Mio_GateReadName((Mio_Gate_t *)pNode->pData);
            else if ( Abc_NtkHasMapping(pNtk) )
                pSopString = Abc_NtkPrintSop(Mio_GateReadSop((Mio_Gate_t *)pNode->pData));
            else
                pSopString = Abc_NtkPrintSop((char *)pNode->pData);
            fprintf( pFile, "  Node%d [label = \"%d\\n%s\"", pNode->Id, pNode->Id, pSopString );
//            fprintf( pFile, "  Node%d [label = \"%d\\n%s\"", pNode->Id, 
//                SuppSize, 
//                pSopString );

            fprintf( pFile, ", shape = ellipse" );
            if ( pNode->fMarkB )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate the PI nodes if any
    if ( LevelMin == 0 )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  LevelMin );
        // generate the PO nodes
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        {
            if ( !Abc_ObjIsCi(pNode) )
            {
                // check if the costant node is present
                if ( Abc_ObjFaninNum(pNode) == 0 && Abc_ObjFanoutNum(pNode) > 0 )
                {
                    fprintf( pFile, "  Node%d [label = \"Const%d\"", pNode->Id, Abc_NtkIsStrash(pNode->pNtk) || Abc_NodeIsConst1(pNode) );
                    fprintf( pFile, ", shape = ellipse" );
                    if ( pNode->fMarkB )
                        fprintf( pFile, ", style = filled" );
                    fprintf( pFile, ", color = coral, fillcolor = coral" );
                    fprintf( pFile, "];\n" );
                }
                continue;
            }
            fprintf( pFile, "  Node%d [label = \"%s\"", 
                pNode->Id, 
                (Abc_ObjIsBo(pNode)? Abc_ObjName(Abc_ObjFanin0(pNode)):Abc_ObjName(pNode)) );
            fprintf( pFile, ", shape = %s", (Abc_ObjIsBo(pNode)? "box":"triangle") );
            if ( pNode->fMarkB )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, ", color = coral, fillcolor = coral" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate invisible edges from the square down
    fprintf( pFile, "title1 -> title2 [style = invis];\n" );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( (int)pNode->Level != LevelMax )
            continue;
        fprintf( pFile, "title2 -> Node%d [style = invis];\n", pNode->Id );
    }
    // generate invisible edges among the COs
    Prev = -1;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( (int)pNode->Level != LevelMax )
            continue;
        if ( !Abc_ObjIsPo(pNode) )
            continue;
        if ( Prev >= 0 )
            fprintf( pFile, "Node%d -> Node%d [style = invis];\n", Prev, pNode->Id );
        Prev = pNode->Id;
    }

    // generate edges
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( Abc_ObjIsLatch(pNode) )
            continue;
        Abc_ObjForEachFanin( pNode, pFanin, k )
        {
            if ( Abc_ObjIsLatch(pFanin) )
                continue;
            fCompl = 0;
            if ( Abc_NtkIsStrash(pNtk) )
                fCompl = Abc_ObjFaninC(pNode, k);
            // generate the edge from this node to the next
            fprintf( pFile, "Node%d",  pNode->Id );
            fprintf( pFile, " -> " );
            fprintf( pFile, "Node%d",  pFanin->Id );
            fprintf( pFile, " [style = %s", fCompl? "dotted" : "solid" );
//            fprintf( pFile, ", label = \"%c\"", 'a' + k );
            fprintf( pFile, "]" );
            fprintf( pFile, ";\n" );
        }
    }

    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );
    fclose( pFile );

    // unmark the nodes from the set
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        pNode->fMarkC = 0;
    if ( vNodesShow )
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodesShow, pNode, i )
            pNode->fMarkB = 0;

    // convert the network back into BDDs if this is how it was
    if ( fHasBdds )
        Abc_NtkSopToBdd(pNtk);
}